

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.c
# Opt level: O3

int32_t json_object_get_int(json_object *jso)

{
  double dVar1;
  long lVar2;
  int iVar3;
  int *piVar4;
  json_object_to_json_string_fn *pjVar5;
  json_object_to_json_string_fn **buf;
  json_object_int *jsoint;
  int64_t cint64;
  json_object_to_json_string_fn *local_20;
  
  local_20 = (json_object_to_json_string_fn *)0x0;
  piVar4 = __errno_location();
  *piVar4 = 0;
  pjVar5 = (json_object_to_json_string_fn *)0x0;
  if (jso == (json_object *)0x0) goto switchD_00105624_caseD_4;
  switch(jso->o_type) {
  case json_type_boolean:
    pjVar5 = (json_object_to_json_string_fn *)(ulong)jso[1].o_type;
    goto switchD_00105624_caseD_4;
  case json_type_double:
    dVar1 = *(double *)(jso + 1);
    if (dVar1 < -2147483648.0) {
LAB_001056a5:
      *piVar4 = 0x22;
LAB_001056ac:
      pjVar5 = (json_object_to_json_string_fn *)0x80000000;
      goto switchD_00105624_caseD_4;
    }
    if (dVar1 <= 2147483647.0) {
      if (!NAN(dVar1)) {
        pjVar5 = (json_object_to_json_string_fn *)(ulong)(uint)(int)dVar1;
        goto switchD_00105624_caseD_4;
      }
      *piVar4 = 0x16;
      goto LAB_001056ac;
    }
    goto LAB_001056bd;
  case json_type_int:
    local_20 = jso[1]._to_json_string;
    if (jso[1].o_type == json_type_null) goto LAB_00105696;
    pjVar5 = local_20;
    if ((json_object_to_json_string_fn *)0x7ffffffffffffffe < local_20) goto LAB_001056bd;
    break;
  default:
    goto switchD_00105624_caseD_4;
  case json_type_string:
    buf = &jso[1]._to_json_string;
    lVar2._0_4_ = jso[1].o_type;
    lVar2._4_4_ = jso[1]._ref_count;
    if (lVar2 < 0) {
      buf = (json_object_to_json_string_fn **)*buf;
    }
    iVar3 = json_parse_int64((char *)buf,(int64_t *)&local_20);
    pjVar5 = (json_object_to_json_string_fn *)0x0;
    if (iVar3 != 0) goto switchD_00105624_caseD_4;
LAB_00105696:
    pjVar5 = local_20;
    if ((long)local_20 < -0x80000000) goto LAB_001056a5;
  }
  if (0x7fffffff < (long)pjVar5) {
LAB_001056bd:
    *piVar4 = 0x22;
    pjVar5 = (json_object_to_json_string_fn *)0x7fffffff;
  }
switchD_00105624_caseD_4:
  return (int32_t)pjVar5;
}

Assistant:

int32_t json_object_get_int(const struct json_object *jso)
{
	int64_t cint64 = 0;
	double cdouble;
	enum json_type o_type;
	errno = 0;

	if (!jso)
		return 0;

	o_type = jso->o_type;
	if (o_type == json_type_int)
	{
		const struct json_object_int *jsoint = JC_INT_C(jso);
		if (jsoint->cint_type == json_object_int_type_int64)
		{
			cint64 = jsoint->cint.c_int64;
		}
		else
		{
			if (jsoint->cint.c_uint64 >= INT64_MAX)
				cint64 = INT64_MAX;
			else
				cint64 = (int64_t)jsoint->cint.c_uint64;
		}
	}
	else if (o_type == json_type_string)
	{
		/*
		 * Parse strings into 64-bit numbers, then use the
		 * 64-to-32-bit number handling below.
		 */
		if (json_parse_int64(get_string_component(jso), &cint64) != 0)
			return 0; /* whoops, it didn't work. */
		o_type = json_type_int;
	}

	switch (o_type)
	{
	case json_type_int:
		/* Make sure we return the correct values for out of range numbers. */
		if (cint64 < INT32_MIN)
		{
			errno = ERANGE;
			return INT32_MIN;
		}
		if (cint64 > INT32_MAX)
		{
			errno = ERANGE;
			return INT32_MAX;
		}
		return (int32_t)cint64;
	case json_type_double:
		cdouble = JC_DOUBLE_C(jso)->c_double;
		if (cdouble < INT32_MIN)
		{
			errno = ERANGE;
			return INT32_MIN;
		}
		if (cdouble > INT32_MAX)
		{
			errno = ERANGE;
			return INT32_MAX;
		}
		if (isnan(cdouble))
		{
			errno = EINVAL;
			return INT32_MIN;
		}
		return (int32_t)cdouble;
	case json_type_boolean: return JC_BOOL_C(jso)->c_boolean;
	default: return 0;
	}
}